

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O3

void __thiscall QUnifiedTimer::uninstallAnimationDriver(QUnifiedTimer *this,QAnimationDriver *d)

{
  if (*(QAnimationDriver **)(this + 0x10) == d) {
    if (*(char *)&((*(QAnimationDriver **)(this + 0x10))->super_QObject).d_ptr.d[1].metaObject ==
        '\x01') {
      stopAnimationDriver(this);
      *(QUnifiedTimer **)(this + 0x10) = this + 0x18;
      this[0x66] = (QUnifiedTimer)0x0;
      startAnimationDriver(this);
      return;
    }
    *(QUnifiedTimer **)(this + 0x10) = this + 0x18;
    this[0x66] = (QUnifiedTimer)0x0;
  }
  else {
    uninstallAnimationDriver();
  }
  return;
}

Assistant:

void QUnifiedTimer::uninstallAnimationDriver(QAnimationDriver *d)
{
    if (driver != d) {
        qWarning("QUnifiedTimer: trying to uninstall a driver that is not installed...");
        return;
    }

    bool running = driver->isRunning();
    if (running)
        stopAnimationDriver();
    driver = &defaultDriver;
    allowNegativeDelta = false;
    if (running)
        startAnimationDriver();
}